

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O1

Slice __thiscall leveldb::anon_unknown_3::DBIter::key(DBIter *this)

{
  int iVar1;
  undefined4 extraout_var;
  ulong extraout_RDX;
  size_type sVar3;
  Slice SVar4;
  pointer pcVar2;
  
  if (this->valid_ == false) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                  ,0x41,"virtual Slice leveldb::(anonymous namespace)::DBIter::key() const");
  }
  if (this->direction_ == kForward) {
    iVar1 = (*this->iter_->_vptr_Iterator[8])();
    pcVar2 = (pointer)CONCAT44(extraout_var,iVar1);
    if (extraout_RDX < 8) {
      __assert_fail("internal_key.size() >= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.h"
                    ,0x5e,"Slice leveldb::ExtractUserKey(const Slice &)");
    }
    sVar3 = extraout_RDX - 8;
  }
  else {
    pcVar2 = (this->saved_key_)._M_dataplus._M_p;
    sVar3 = (this->saved_key_)._M_string_length;
  }
  SVar4.size_ = sVar3;
  SVar4.data_ = pcVar2;
  return SVar4;
}

Assistant:

Slice key() const override {
    assert(valid_);
    return (direction_ == kForward) ? ExtractUserKey(iter_->key()) : saved_key_;
  }